

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

float * Tim_ManGetReqTimes(Tim_Man_t *p)

{
  float fVar1;
  uint uVar2;
  Tim_Obj_t *pTVar3;
  int iVar4;
  ulong uVar5;
  float *__s;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  uVar5 = 0;
  uVar6 = (ulong)(uint)p->nCos;
  if (p->nCos < 1) {
    uVar6 = uVar5;
  }
  lVar7 = 0x14;
  do {
    if (uVar6 == uVar5) {
LAB_003e45db:
      iVar4 = Tim_ManPoNum(p);
      iVar9 = 0;
      if ((int)uVar6 == iVar4) {
        __s = (float *)0x0;
      }
      else {
        uVar2 = p->nCos;
        __s = (float *)malloc((long)(int)uVar2 << 2);
        memset(__s,0xff,(long)(int)uVar2 << 2);
        uVar6 = 0;
        if (0 < (int)uVar2) {
          uVar6 = (ulong)uVar2;
        }
        lVar7 = 0;
        while ((uVar6 * 0x18 - lVar7 != 0 && (pTVar3 = p->pCos, pTVar3 != (Tim_Obj_t *)0x0))) {
          if (*(int *)((long)&pTVar3->iObj2Box + lVar7) < 0) {
            lVar8 = (long)iVar9;
            iVar9 = iVar9 + 1;
            __s[lVar8] = *(float *)((long)&pTVar3->timeArr + lVar7);
          }
          lVar7 = lVar7 + 0x18;
        }
        iVar4 = Tim_ManPoNum(p);
        if (iVar9 != iVar4) {
          __assert_fail("k == Tim_ManPoNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/tim/timMan.c"
                        ,0x1fe,"float *Tim_ManGetReqTimes(Tim_Man_t *)");
        }
      }
      return __s;
    }
    pTVar3 = p->pCos;
    if ((pTVar3 == (Tim_Obj_t *)0x0) ||
       ((*(int *)((long)pTVar3 + lVar7 + -0xc) < 0 &&
        ((fVar1 = *(float *)((long)&pTVar3->Id + lVar7), fVar1 != 1e+09 || (NAN(fVar1))))))) {
      uVar6 = uVar5 & 0xffffffff;
      goto LAB_003e45db;
    }
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 0x18;
  } while( true );
}

Assistant:

float * Tim_ManGetReqTimes( Tim_Man_t * p )
{
    float * pTimes;
    Tim_Obj_t * pObj;
    int i, k = 0;
    Tim_ManForEachPo( p, pObj, i )
        if ( pObj->timeReq != TIM_ETERNITY )
            break;
    if ( i == Tim_ManPoNum(p) )
        return NULL;
    pTimes  = ABC_FALLOC( float, Tim_ManCoNum(p) );
    Tim_ManForEachPo( p, pObj, i )
        pTimes[k++] = pObj->timeArr;
    assert( k == Tim_ManPoNum(p) );
    return pTimes;
}